

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkAlloc(char *pName,int nObjsAlloc)

{
  Wlc_Ntk_t *pWVar1;
  char *pcVar2;
  Mem_Flex_t *pMVar3;
  Wlc_Obj_t *pWVar4;
  
  pWVar1 = (Wlc_Ntk_t *)calloc(1,600);
  if (pName == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = Extra_FileNameGeneric(pName);
  }
  pWVar1->pName = pcVar2;
  Vec_IntGrow(&pWVar1->vPis,0x6f);
  Vec_IntGrow(&pWVar1->vPos,0x6f);
  Vec_IntGrow(&pWVar1->vCis,0x6f);
  Vec_IntGrow(&pWVar1->vCos,0x6f);
  Vec_IntGrow(&pWVar1->vFfs,0x6f);
  pMVar3 = Mem_FlexStart();
  pWVar1->pMemFanin = pMVar3;
  pWVar1->nObjsAlloc = nObjsAlloc;
  pWVar4 = (Wlc_Obj_t *)calloc((long)nObjsAlloc,0x18);
  pWVar1->pObjs = pWVar4;
  pWVar1->iObj = 1;
  return pWVar1;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkAlloc( char * pName, int nObjsAlloc )
{
    Wlc_Ntk_t * p;
    p = ABC_CALLOC( Wlc_Ntk_t, 1 );
    p->pName = pName ? Extra_FileNameGeneric( pName ) : NULL;
    Vec_IntGrow( &p->vPis, 111 );
    Vec_IntGrow( &p->vPos, 111 );
    Vec_IntGrow( &p->vCis, 111 );
    Vec_IntGrow( &p->vCos, 111 );
    Vec_IntGrow( &p->vFfs, 111 );
    p->pMemFanin = Mem_FlexStart();
    p->nObjsAlloc = nObjsAlloc;  
    p->pObjs = ABC_CALLOC( Wlc_Obj_t, p->nObjsAlloc );
    p->iObj = 1;
    return p;
}